

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

void __thiscall trun::TestRunner::DumpTestsToRun(TestRunner *this)

{
  bool bVar1;
  uint uVar2;
  Config *pCVar3;
  reference __in;
  type *this_00;
  __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar4;
  char *pcVar5;
  reference psVar6;
  element_type *peVar7;
  string *psVar8;
  char *pcVar9;
  char *pcVar10;
  bool local_169;
  bool local_131;
  bool local_f9;
  char local_e1;
  char local_c9;
  undefined1 local_b8 [7];
  bool bExecTest_2;
  shared_ptr<trun::TestFunc> t_2;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *__range2;
  undefined1 local_88 [7];
  bool bExecTest_1;
  Ref t_1;
  undefined1 local_60 [7];
  bool bExecTest;
  Ref t;
  bool bExec;
  type *module;
  type *moduleName;
  _Self local_30;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
  *__range1;
  int nTestCases;
  int nModules;
  TestRunner *this_local;
  
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  bVar1 = std::operator==(&this->globalMain,(nullptr_t)0x0);
  if ((((bVar1 ^ 0xffU) & 1) != 0) ||
     (bVar1 = std::operator==(&this->globalExit,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    pCVar3 = Config::Instance();
    local_c9 = '*';
    if ((pCVar3->testGlobalMain & 1U) == 0) {
      local_c9 = '-';
    }
    printf("%c Globals:\n",(ulong)(uint)(int)local_c9);
    bVar1 = std::operator==(&this->globalMain,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->globalMain);
      psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->globalMain);
      psVar8 = TestFunc::SymbolName_abi_cxx11_(peVar7);
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      printf("    ::%s (%s)\n",pcVar5,pcVar9);
    }
    bVar1 = std::operator==(&this->globalExit,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->globalExit);
      psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->globalExit);
      psVar8 = TestFunc::SymbolName_abi_cxx11_(peVar7);
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      printf("    ::%s (%s)\n",pcVar5,pcVar9);
    }
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
           ::begin(&this->testModules);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
       ::end(&this->testModules);
  while (bVar1 = std::operator==(&__end1,&local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>
           ::operator*(&__end1);
    this_00 = std::get<0ul,std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>(__in);
    this_01 = (__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::get<1ul,std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>(__in);
    peVar4 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         TestModule::ShouldExecute(peVar4);
    local_e1 = '*';
    if (!(bool)t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _7_1_) {
      local_e1 = '-';
    }
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (this_00);
    printf("%c Module: %s\n",(ulong)(uint)(int)local_e1,pcVar5);
    peVar4 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    bVar1 = std::operator==(&peVar4->mainFunc,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      peVar4 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      std::shared_ptr<trun::TestFunc>::shared_ptr
                ((shared_ptr<trun::TestFunc> *)local_60,&peVar4->mainFunc);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      bVar1 = TestFunc::ShouldExecuteNoDeps(peVar7);
      local_f9 = false;
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        local_f9 = TestModule::ShouldExecute(peVar4);
      }
      uVar2 = 0x20;
      if (local_f9 != false) {
        uVar2 = 0x2a;
      }
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      psVar8 = TestFunc::SymbolName_abi_cxx11_(peVar7);
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      printf("  %cm %s (%s)\n",(ulong)uVar2,pcVar5,pcVar9);
      __range1._0_4_ = (uint)__range1 + 1;
      std::shared_ptr<trun::TestFunc>::~shared_ptr((shared_ptr<trun::TestFunc> *)local_60);
    }
    peVar4 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    bVar1 = std::operator==(&peVar4->exitFunc,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      peVar4 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      std::shared_ptr<trun::TestFunc>::shared_ptr
                ((shared_ptr<trun::TestFunc> *)local_88,&peVar4->exitFunc);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      bVar1 = TestFunc::ShouldExecuteNoDeps(peVar7);
      local_131 = false;
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        local_131 = TestModule::ShouldExecute(peVar4);
      }
      uVar2 = 0x20;
      if (local_131 != false) {
        uVar2 = 0x2a;
      }
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      psVar8 = TestFunc::SymbolName_abi_cxx11_(peVar7);
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      printf("  %ce %s (%s)\n",(ulong)uVar2,pcVar5,pcVar9);
      __range1._0_4_ = (uint)__range1 + 1;
      std::shared_ptr<trun::TestFunc>::~shared_ptr((shared_ptr<trun::TestFunc> *)local_88);
    }
    peVar4 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    __end2 = std::
             vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
             ::begin(&peVar4->testFuncs);
    t_2.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
         ::end(&peVar4->testFuncs);
    while (bVar1 = __gnu_cxx::
                   operator==<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                             (&__end2,(__normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                                       *)&t_2.
                                          super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), ((bVar1 ^ 0xffU) & 1) != 0) {
      psVar6 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
               ::operator*(&__end2);
      std::shared_ptr<trun::TestFunc>::shared_ptr((shared_ptr<trun::TestFunc> *)local_b8,psVar6);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b8);
      bVar1 = TestFunc::ShouldExecuteNoDeps(peVar7);
      local_169 = false;
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        local_169 = TestModule::ShouldExecute(peVar4);
      }
      uVar2 = 0x20;
      if (local_169 != false) {
        uVar2 = 0x2a;
      }
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(this_00);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b8);
      psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b8);
      psVar8 = TestFunc::SymbolName_abi_cxx11_(peVar7);
      pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str(psVar8);
      printf("  %c  %s::%s (%s)\n",(ulong)uVar2,pcVar5,pcVar9,pcVar10);
      __range1._0_4_ = (uint)__range1 + 1;
      std::shared_ptr<trun::TestFunc>::~shared_ptr((shared_ptr<trun::TestFunc> *)local_b8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
      ::operator++(&__end2);
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>
    ::operator++(&__end1);
  }
  printf("=== Modules: %d\n",(ulong)__range1._4_4_);
  printf("=== Cases..: %d\n",(ulong)(uint)__range1);
  return;
}

Assistant:

void TestRunner::DumpTestsToRun() {
    int nModules = 0;
    int nTestCases = 0;

    // Dump 'test_main' / 'test_exit' (i.e. global main/exit)
    if ((globalMain != nullptr) || (globalExit != nullptr)){
        printf("%c Globals:\n", Config::Instance().testGlobalMain?'*':'-');
        if (globalMain != nullptr) {
            printf("    ::%s (%s)\n", globalMain->CaseName().c_str(), globalMain->SymbolName().c_str());
        }
        if (globalExit != nullptr) {
            printf("    ::%s (%s)\n", globalExit->CaseName().c_str(), globalExit->SymbolName().c_str());
        }
    }

    // Dump info for each module...
    for(auto &[moduleName, module] : testModules) {
        bool bExec = module->ShouldExecute();
        printf("%c Module: %s\n",bExec?'*':'-',moduleName.c_str());
        if (module->mainFunc != nullptr) {
            auto t = module->mainFunc;
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %cm %s (%s)\n", bExecTest?'*':' ',t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        if (module->exitFunc != nullptr) {
            auto t = module->exitFunc;
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %ce %s (%s)\n",bExecTest?'*':' ', t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        for(auto t : module->testFuncs) {
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %c  %s::%s (%s)\n", bExecTest?'*':' ',moduleName.c_str(), t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        nModules++;
    }
    printf("=== Modules: %d\n", nModules);
    printf("=== Cases..: %d\n", nTestCases);
}